

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seed_gen_exception.cc
# Opt level: O1

void absl::lts_20240722::random_internal::ThrowSeedGenException(void)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = &PTR__SeedGenException_00103d98;
  __cxa_throw(puVar1,&SeedGenException::typeinfo,SeedGenException::~SeedGenException);
}

Assistant:

void ThrowSeedGenException() {
#ifdef ABSL_HAVE_EXCEPTIONS
  throw absl::SeedGenException();
#else
  std::cerr << kExceptionMessage << std::endl;
  std::terminate();
#endif
}